

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Tree.cxx
# Opt level: O2

void __thiscall Fl_Tree::show_item(Fl_Tree *this,Fl_Tree_Item *item,int yoff)

{
  double dVar1;
  Fl_Scrollbar *this_00;
  int iVar2;
  int iVar3;
  
  if ((item == (Fl_Tree_Item *)0x0) && (item = this->_root, item == (Fl_Tree_Item *)0x0)) {
    return;
  }
  this_00 = this->_vscroll;
  iVar3 = (item->_xywh[1] - (yoff + (this->super_Fl_Group).super_Fl_Widget.y_)) +
          (int)(this_00->super_Fl_Slider).super_Fl_Valuator.value_;
  dVar1 = (this_00->super_Fl_Slider).super_Fl_Valuator.min;
  iVar2 = (int)dVar1;
  if (dVar1 <= (double)iVar3) {
    iVar2 = iVar3;
  }
  dVar1 = (this_00->super_Fl_Slider).super_Fl_Valuator.max;
  iVar3 = (int)dVar1;
  if ((double)iVar2 <= dVar1) {
    iVar3 = iVar2;
  }
  Fl_Scrollbar::value(this_00,iVar3);
  Fl_Widget::redraw((Fl_Widget *)this);
  return;
}

Assistant:

void Fl_Tree::show_item(Fl_Tree_Item *item, int yoff) {
  item = item ? item : first();
  if (!item) return;
  int newval = item->y() - y() - yoff + (int)_vscroll->value();
  if ( newval < _vscroll->minimum() ) newval = (int)_vscroll->minimum();
  if ( newval > _vscroll->maximum() ) newval = (int)_vscroll->maximum();
  _vscroll->value(newval);
  redraw();
}